

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CountDownLatch.cpp
# Opt level: O2

void __thiscall CountDownLatch::countDown(CountDownLatch *this)

{
  int *piVar1;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  piVar1 = &this->count_;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    pthread_cond_broadcast((pthread_cond_t *)&(this->condition_).cond);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void CountDownLatch::countDown(){
    MutexLockGuard lock(mutex_);
    --count_;
    if(count_==0) condition_.notifyAll();
}